

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Value::Value(Value *this,Value *param_1)

{
  int iVar1;
  Value *param_1_local;
  Value *this_local;
  
  iVar1 = param_1->int_value_;
  this->type_ = param_1->type_;
  this->int_value_ = iVar1;
  this->real_value_ = param_1->real_value_;
  std::__cxx11::string::string((string *)&this->string_value_,(string *)&param_1->string_value_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->binary_value_,&param_1->binary_value_);
  std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::vector
            (&this->array_value_,&param_1->array_value_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->object_value_,&param_1->object_value_);
  this->boolean_value_ = (bool)(param_1->boolean_value_ & 1);
  return;
}

Assistant:

char Type() const { return static_cast<char>(type_); }